

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O1

void __thiscall
cfd::api::json::DecodeLockingScript::DecodeLockingScript
          (DecodeLockingScript *this,DecodeLockingScript *param_1)

{
  pointer pcVar1;
  
  (this->super_JsonClassBase<cfd::api::json::DecodeLockingScript>)._vptr_JsonClassBase =
       (_func_int **)&PTR__DecodeLockingScript_002b3d30;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->ignore_items)._M_t,&(param_1->ignore_items)._M_t);
  (this->asm__)._M_dataplus._M_p = (pointer)&(this->asm__).field_2;
  pcVar1 = (param_1->asm__)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->asm__,pcVar1,pcVar1 + (param_1->asm__)._M_string_length);
  (this->hex_)._M_dataplus._M_p = (pointer)&(this->hex_).field_2;
  pcVar1 = (param_1->hex_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->hex_,pcVar1,pcVar1 + (param_1->hex_)._M_string_length);
  this->req_sigs_ = param_1->req_sigs_;
  (this->type_)._M_dataplus._M_p = (pointer)&(this->type_).field_2;
  pcVar1 = (param_1->type_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->type_,pcVar1,pcVar1 + (param_1->type_)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&(this->addresses_).
            super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ,&(param_1->addresses_).
             super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  (this->addresses_).
  super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_JsonVector = (_func_int **)&PTR__JsonVector_002b3660;
  return;
}

Assistant:

DecodeLockingScript() {
    CollectFieldName();
  }